

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

void __thiscall glslang::TShader::~TShader(TShader *this)

{
  TInfoSink *this_00;
  TIntermediate *this_01;
  TPoolAllocator *this_02;
  
  this->_vptr_TShader = (_func_int **)&PTR__TShader_00a5af80;
  this_00 = this->infoSink;
  if (this_00 != (TInfoSink *)0x0) {
    TInfoSink::~TInfoSink(this_00);
  }
  operator_delete(this_00,0x60);
  if (this->compiler != (TCompiler *)0x0) {
    (*(this->compiler->super_TShHandleBase)._vptr_TShHandleBase[1])();
  }
  this_01 = this->intermediate;
  if (this_01 != (TIntermediate *)0x0) {
    TIntermediate::~TIntermediate(this_01);
  }
  operator_delete(this_01,0x7e8);
  this_02 = this->pool;
  if (this_02 != (TPoolAllocator *)0x0) {
    TPoolAllocator::~TPoolAllocator(this_02);
  }
  operator_delete(this_02,0x60);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TShader::~TShader()
{
    delete infoSink;
    delete compiler;
    delete intermediate;
    delete pool;
}